

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O2

void nsync::nsync_mu_lock(nsync_mu *mu)

{
  uint uVar1;
  waiter *w;
  bool bVar2;
  
  LOCK();
  bVar2 = (mu->word).super___atomic_base<unsigned_int>._M_i == 0;
  if (bVar2) {
    (mu->word).super___atomic_base<unsigned_int>._M_i = 1;
  }
  UNLOCK();
  if (bVar2) {
    return;
  }
  uVar1 = (mu->word).super___atomic_base<unsigned_int>._M_i;
  if ((uVar1 & 0xffffff41) == 0) {
    LOCK();
    bVar2 = uVar1 == (mu->word).super___atomic_base<unsigned_int>._M_i;
    if (bVar2) {
      (mu->word).super___atomic_base<unsigned_int>._M_i = (uVar1 & 0x9e) + 1;
    }
    UNLOCK();
    if (bVar2) {
      return;
    }
  }
  w = nsync_waiter_new_();
  nsync_mu_lock_slow_(mu,w,0,(lock_type *)nsync_writer_type_);
  nsync_waiter_free_(w);
  return;
}

Assistant:

void nsync_mu_lock (nsync_mu *mu) {
	IGNORE_RACES_START ();
	if (!ATM_CAS_ACQ (&mu->word, 0, MU_WADD_TO_ACQUIRE)) { /* acquire CAS */
		uint32_t old_word = ATM_LOAD (&mu->word);
		if ((old_word&MU_WZERO_TO_ACQUIRE) != 0 ||
		    !ATM_CAS_ACQ (&mu->word, old_word,
				  (old_word+MU_WADD_TO_ACQUIRE) & ~MU_WCLEAR_ON_ACQUIRE)) {
			waiter *w = nsync_waiter_new_ ();
			nsync_mu_lock_slow_ (mu, w, 0, nsync_writer_type_);
			nsync_waiter_free_ (w);
		}
	}
	IGNORE_RACES_END ();
	RWLOCK_TRYACQUIRE (1, mu, 1);
}